

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_898a9ca8 comp,int bad_allowed,bool leftmost)

{
  CliqueVar *pCVar1;
  CliqueVar CVar2;
  anon_class_8_1_898a9ca8 aVar3;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var4;
  bool bVar5;
  ulong uVar6;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var7;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
  __cmp;
  ulong uVar8;
  CliqueVar *pCVar9;
  long lVar10;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var11;
  long lVar12;
  ulong uVar13;
  CliqueVar CVar14;
  long lVar15;
  CliqueVar __tmp;
  CliqueVar b;
  int local_8c;
  anon_class_8_1_898a9ca8 comp_local;
  anon_class_8_1_898a9ca8 local_68;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_60;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_58;
  _DistanceType __len;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_48;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_40;
  long local_38;
  
  local_60._M_current = end._M_current + -1;
  local_40._M_current = end._M_current + -2;
  local_48._M_current = end._M_current + -3;
  comp_local.data = comp.data;
  local_8c = bad_allowed;
LAB_0027bab3:
  do {
    aVar3.data = comp_local.data;
    local_38 = (long)end._M_current - (long)begin._M_current;
    uVar6 = local_38 >> 2;
    if ((long)uVar6 < 0x18) {
      if ((leftmost & 1U) == 0) {
        local_68.data = comp_local.data;
        if (begin._M_current != end._M_current) {
          while (pCVar9 = begin._M_current + 1, pCVar9 != end._M_current) {
            CVar14 = *begin._M_current;
            CVar2 = begin._M_current[1];
            bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                              (&local_68,CVar2,CVar14);
            begin._M_current = pCVar9;
            if (bVar5) {
              do {
                *pCVar9 = CVar14;
                CVar14 = pCVar9[-2];
                pCVar9 = pCVar9 + -1;
                bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                                  (&local_68,CVar2,CVar14);
              } while (bVar5);
              *pCVar9 = CVar2;
            }
          }
        }
      }
      else {
        local_68.data = comp_local.data;
        if (begin._M_current != end._M_current) {
          lVar12 = 4;
          _Var7._M_current = begin._M_current;
          while (_Var7._M_current + 1 != end._M_current) {
            CVar14 = *_Var7._M_current;
            CVar2 = _Var7._M_current[1];
            bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                              (&local_68,CVar2,CVar14);
            lVar10 = lVar12;
            if (bVar5) {
              do {
                lVar15 = lVar10;
                *(CliqueVar *)(&(begin._M_current)->field_0x0 + lVar15) = CVar14;
                _Var11._M_current = begin._M_current;
                if (lVar15 == 4) goto LAB_0027bfb4;
                CVar14 = *(CliqueVar *)(&begin._M_current[-2].field_0x0 + lVar15);
                bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                                  (&local_68,CVar2,CVar14);
                lVar10 = lVar15 + -4;
              } while (bVar5);
              _Var11._M_current = (CliqueVar *)(&begin._M_current[-1].field_0x0 + lVar15);
LAB_0027bfb4:
              *_Var11._M_current = CVar2;
            }
            lVar12 = lVar12 + 4;
            _Var7._M_current = _Var7._M_current + 1;
          }
        }
      }
      return;
    }
    uVar8 = uVar6 >> 1;
    _Var7._M_current = begin._M_current + uVar8;
    __len = uVar6;
    if (uVar6 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                (_Var7,begin,local_60,comp_local);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                (begin,_Var7,local_60,comp_local);
      local_58._M_current = begin._M_current + (uVar8 - 1);
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                (begin._M_current + 1,local_58,local_40,aVar3);
      pCVar9 = begin._M_current + uVar8;
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                (begin._M_current + 2,pCVar9 + 1,local_48,aVar3);
      sort3<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                (local_58,_Var7,pCVar9 + 1,aVar3);
      CVar2 = *begin._M_current;
      *begin._M_current = *pCVar9;
      *pCVar9 = CVar2;
    }
    if (((leftmost & 1U) == 0) &&
       (bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                          (&comp_local,begin._M_current[-1],*begin._M_current), !bVar5)) {
      local_68.data = comp_local.data;
      CVar2 = *begin._M_current;
      lVar12 = 0;
      do {
        lVar10 = lVar12;
        CVar14 = *(CliqueVar *)(&end._M_current[-1].field_0x0 + lVar10);
        bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                          (&local_68,CVar2,CVar14);
        lVar12 = lVar10 + -4;
      } while (bVar5);
      pCVar9 = (CliqueVar *)(&end._M_current[-1].field_0x0 + lVar10);
      _Var7._M_current = begin._M_current;
      b = CVar2;
      if (lVar10 + -4 == -4) {
        do {
          if (pCVar9 <= _Var7._M_current) break;
          b = _Var7._M_current[1];
          _Var7._M_current = _Var7._M_current + 1;
          bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                            (&local_68,CVar2,b);
        } while (!bVar5);
      }
      else {
        do {
          b = _Var7._M_current[1];
          _Var7._M_current = _Var7._M_current + 1;
          bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                            (&local_68,CVar2,b);
        } while (!bVar5);
      }
      while (_Var7._M_current < pCVar9) {
        *_Var7._M_current = CVar14;
        *pCVar9 = b;
        do {
          CVar14 = pCVar9[-1];
          pCVar9 = pCVar9 + -1;
          bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                            (&local_68,CVar2,CVar14);
        } while (bVar5);
        do {
          b = _Var7._M_current[1];
          _Var7._M_current = _Var7._M_current + 1;
          bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                            (&local_68,CVar2,b);
        } while (!bVar5);
      }
      *begin._M_current = CVar14;
      *pCVar9 = CVar2;
      begin._M_current = pCVar9 + 1;
      goto LAB_0027bab3;
    }
    local_68.data = comp_local.data;
    CVar2 = *begin._M_current;
    lVar12 = 0;
    do {
      lVar10 = lVar12;
      CVar14 = *(CliqueVar *)(&begin._M_current[1].field_0x0 + lVar10);
      bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                        (&local_68,CVar14,CVar2);
      lVar12 = lVar10 + 4;
    } while (bVar5);
    _Var7._M_current = (CliqueVar *)(&begin._M_current[1].field_0x0 + lVar10);
    _Var11._M_current = end._M_current;
    _Var4._M_current = _Var7._M_current;
    if (lVar10 + 4 == 4) {
      do {
        pCVar9 = _Var11._M_current;
        if (_Var11._M_current <= _Var7._M_current) break;
        pCVar9 = _Var11._M_current + -1;
        _Var11._M_current = _Var11._M_current + -1;
        bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                          (&local_68,*pCVar9,CVar2);
        pCVar9 = _Var11._M_current;
      } while (!bVar5);
    }
    else {
      do {
        pCVar9 = _Var11._M_current + -1;
        _Var11._M_current = _Var11._M_current + -1;
        bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                          (&local_68,*pCVar9,CVar2);
        pCVar9 = _Var11._M_current;
      } while (!bVar5);
    }
    while (local_58._M_current = _Var4._M_current, aVar3.data = comp_local.data,
          _Var7._M_current < _Var11._M_current) {
      *_Var7._M_current = *_Var11._M_current;
      *_Var11._M_current = CVar14;
      do {
        CVar14 = _Var7._M_current[1];
        _Var7._M_current = _Var7._M_current + 1;
        bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                          (&local_68,CVar14,CVar2);
      } while (bVar5);
      do {
        pCVar1 = _Var11._M_current + -1;
        _Var11._M_current = _Var11._M_current + -1;
        bVar5 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                          (&local_68,*pCVar1,CVar2);
        _Var4._M_current = local_58._M_current;
      } while (!bVar5);
    }
    _Var11._M_current = _Var7._M_current + -1;
    *begin._M_current = _Var7._M_current[-1];
    _Var7._M_current[-1] = CVar2;
    uVar8 = (long)_Var11._M_current - (long)begin._M_current >> 2;
    uVar6 = (long)end._M_current - (long)_Var7._M_current >> 2;
    if (((long)uVar8 < (long)((ulong)__len >> 3)) || ((long)uVar6 < (long)((ulong)__len >> 3))) {
      local_8c = local_8c + -1;
      if (local_8c == 0) {
        uVar6 = __len - 2U >> 1;
        do {
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>>
                    (begin,uVar6,__len,begin._M_current[uVar6],
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
                      )aVar3.data);
          bVar5 = uVar6 != 0;
          uVar6 = uVar6 - 1;
          lVar12 = local_38;
        } while (bVar5);
        while (_Var7._M_current = local_60._M_current, 4 < lVar12) {
          CVar2 = *local_60._M_current;
          *local_60._M_current = *begin._M_current;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,long,HighsCliqueTable::CliqueVar,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>>
                    (begin,0,lVar12 + -4 >> 2,CVar2,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:220:45)>
                      )aVar3.data);
          local_60._M_current = _Var7._M_current + -1;
          lVar12 = lVar12 + -4;
        }
        return;
      }
      if (0x17 < (long)uVar8) {
        CVar2 = *begin._M_current;
        uVar13 = uVar8 & 0xfffffffffffffffc;
        *begin._M_current = *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar13);
        *(CliqueVar *)(&(begin._M_current)->field_0x0 + uVar13) = CVar2;
        CVar2 = _Var7._M_current[-2];
        _Var7._M_current[-2] = *(_Var7._M_current + (-4 - uVar13));
        *(_Var7._M_current + (-4 - uVar13)) = CVar2;
        if (0x80 < uVar8) {
          uVar8 = uVar8 >> 2;
          CVar2 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar8 + 1];
          begin._M_current[uVar8 + 1] = CVar2;
          CVar2 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar8 + 2];
          begin._M_current[uVar8 + 2] = CVar2;
          CVar2 = _Var7._M_current[-3];
          _Var7._M_current[-3] = _Var7._M_current[~uVar8 - 1];
          _Var7._M_current[~uVar8 - 1] = CVar2;
          CVar2 = _Var7._M_current[-4];
          _Var7._M_current[-4] = _Var7._M_current[-uVar8 + -3];
          _Var7._M_current[-uVar8 + -3] = CVar2;
        }
      }
      if (0x17 < (long)uVar6) {
        uVar8 = uVar6 & 0xfffffffffffffffc;
        CVar2 = *_Var7._M_current;
        *_Var7._M_current = *(CliqueVar *)(&(_Var7._M_current)->field_0x0 + uVar8);
        *(CliqueVar *)(&(_Var7._M_current)->field_0x0 + uVar8) = CVar2;
        CVar2 = end._M_current[-1];
        end._M_current[-1] = *(end._M_current - uVar8);
        *(end._M_current - uVar8) = CVar2;
        if (0x80 < uVar6) {
          uVar6 = uVar6 >> 2;
          CVar2 = _Var7._M_current[1];
          _Var7._M_current[1] = _Var7._M_current[uVar6 + 1];
          _Var7._M_current[uVar6 + 1] = CVar2;
          CVar2 = _Var7._M_current[2];
          _Var7._M_current[2] = _Var7._M_current[uVar6 + 2];
          _Var7._M_current[uVar6 + 2] = CVar2;
          CVar2 = end._M_current[-2];
          end._M_current[-2] = end._M_current[~uVar6];
          end._M_current[~uVar6] = CVar2;
          CVar2 = end._M_current[-3];
          end._M_current[-3] = end._M_current[-2 - uVar6];
          end._M_current[-2 - uVar6] = CVar2;
        }
      }
    }
    else if (((pCVar9 <= local_58._M_current) &&
             (bVar5 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                                (begin,_Var11,comp_local), bVar5)) &&
            (bVar5 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
                               (_Var7,end,aVar3), bVar5)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
              (begin,_Var11,comp_local,local_8c,(bool)(leftmost & 1));
    leftmost = false;
    begin._M_current = _Var7._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }